

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phyr_math.h
# Opt level: O2

ostream * phyr::operator<<(ostream *os,Mat4x4 *mat)

{
  ostream *poVar1;
  double (*padVar2) [4];
  int i;
  long lVar3;
  int j;
  long lVar4;
  
  padVar2 = (double (*) [4])mat;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      poVar1 = std::ostream::_M_insert<double>((*(double (*) [4])*padVar2)[lVar4]);
      std::operator<<(poVar1,", ");
    }
    std::ostream::_M_insert<double>(mat->d[lVar3][3]);
    if (lVar3 != 3) {
      std::operator<<(os,"\n");
    }
    padVar2 = padVar2 + 1;
  }
  return os;
}

Assistant:

inline std::ostream& operator<<(std::ostream& os, const Mat4x4& mat) {
    for (int i = 0; i < 4; i++) {
        for (int j = 0; j < 3; j++)
            os << mat(i, j) << ", ";
        os << mat(i, 3); if (i < 3) os << "\n";
    }

    return os;
}